

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::FieldDescriptor::DebugString
          (FieldDescriptor *this,int depth,PrintLabelFlag print_label_flag,string *contents,
          DebugStringOptions *debug_string_options)

{
  bool bVar1;
  bool bVar2;
  Type TVar3;
  Descriptor *pDVar4;
  FieldDescriptor *pFVar5;
  SourceLocationCommentPrinter *this_00;
  string label;
  string formatted_options;
  string field_type;
  string prefix;
  undefined1 local_298 [48];
  string local_268;
  SubstituteArg local_248;
  undefined1 local_218 [48];
  SubstituteArg local_1e8;
  SubstituteArg local_1b8;
  SubstituteArg local_188;
  SourceLocationCommentPrinter comment_printer;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  std::__cxx11::string::_M_construct((ulong)&prefix,(char)depth * '\x02');
  field_type._M_dataplus._M_p = (pointer)&field_type.field_2;
  field_type._M_string_length = 0;
  field_type.field_2._M_local_buf[0] = '\0';
  bVar1 = is_map(this);
  if (bVar1) {
    pDVar4 = message_type(this);
    FieldTypeNameDebugString_abi_cxx11_((string *)local_298,*(FieldDescriptor **)(pDVar4 + 0x30));
    comment_printer._0_8_ = local_298._0_8_;
    comment_printer.source_loc_.start_line = local_298._8_4_;
    pDVar4 = message_type(this);
    FieldTypeNameDebugString_abi_cxx11_(&label,(FieldDescriptor *)(*(long *)(pDVar4 + 0x30) + 0xa8))
    ;
    local_188.text_ = (char *)0x0;
    local_188.size_ = -1;
    local_1b8.text_ = (char *)0x0;
    local_1b8.size_ = -1;
    local_1e8.text_ = (char *)0x0;
    local_1e8.size_ = -1;
    local_218._0_8_ = (char *)0x0;
    local_218._8_4_ = -1;
    local_248.text_ = (char *)0x0;
    local_248.size_ = 0xffffffff;
    local_60.text_ = (char *)0x0;
    formatted_options._M_dataplus = label._M_dataplus;
    local_60.size_ = -1;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    formatted_options._M_string_length =
         CONCAT44(formatted_options._M_string_length._4_4_,(int)label._M_string_length);
    local_c0.size_ = -1;
    strings::SubstituteAndAppend
              (&field_type,"map<$0, $1>",(SubstituteArg *)&comment_printer,
               (SubstituteArg *)&formatted_options,&local_188,&local_1b8,&local_1e8,
               (SubstituteArg *)local_218,(SubstituteArg *)(local_298 + 0x50),&local_60,&local_90,
               &local_c0);
    std::__cxx11::string::~string((string *)&label);
    this_00 = (SourceLocationCommentPrinter *)local_298;
  }
  else {
    FieldTypeNameDebugString_abi_cxx11_((string *)&comment_printer,this);
    this_00 = &comment_printer;
    std::__cxx11::string::operator=((string *)&field_type,(string *)this_00);
  }
  std::__cxx11::string::~string((string *)this_00);
  if ((*(int *)(this + 0x4c) == 1) &&
     ((print_label_flag == OMIT_LABEL || (*(int *)(*(long *)(this + 0x30) + 0x8c) == 3)))) {
    label._M_dataplus._M_p = (pointer)&label.field_2;
    label._M_string_length = 0;
    label.field_2._M_local_buf[0] = '\0';
  }
  else {
    bVar1 = is_map(this);
    label._M_dataplus._M_p = (pointer)&label.field_2;
    label._M_string_length = 0;
    label.field_2._M_local_buf[0] = '\0';
    if (!bVar1) {
      std::__cxx11::string::assign((char *)&label);
      std::__cxx11::string::push_back((char)&label);
    }
  }
  comment_printer.source_loc_.leading_comments._M_dataplus._M_p =
       (pointer)&comment_printer.source_loc_.leading_comments.field_2;
  comment_printer.source_loc_.leading_comments._M_string_length = 0;
  comment_printer.source_loc_.leading_comments.field_2._M_local_buf[0] = '\0';
  comment_printer.source_loc_.trailing_comments._M_dataplus._M_p =
       (pointer)&comment_printer.source_loc_.trailing_comments.field_2;
  comment_printer.source_loc_.trailing_comments._M_string_length = 0;
  comment_printer.source_loc_.trailing_comments.field_2._M_local_buf[0] = '\0';
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  comment_printer.options_.include_comments = debug_string_options->include_comments;
  comment_printer.options_.elide_group_body = debug_string_options->elide_group_body;
  comment_printer.options_.elide_oneof_body = debug_string_options->elide_oneof_body;
  std::__cxx11::string::string((string *)&comment_printer.prefix_,(string *)&prefix);
  if (debug_string_options->include_comments == true) {
    bVar1 = GetSourceLocation(this,&comment_printer.source_loc_);
  }
  else {
    bVar1 = false;
  }
  comment_printer.have_source_loc_ = bVar1;
  anon_unknown_1::SourceLocationCommentPrinter::AddPreComment(&comment_printer,contents);
  formatted_options._M_dataplus = prefix._M_dataplus;
  formatted_options._M_string_length =
       CONCAT44(formatted_options._M_string_length._4_4_,(undefined4)prefix._M_string_length);
  local_188.text_ = label._M_dataplus._M_p;
  local_188.size_ = (int)label._M_string_length;
  local_1b8.text_ = field_type._M_dataplus._M_p;
  local_1b8.size_ = (int)field_type._M_string_length;
  TVar3 = type(this);
  pFVar5 = this;
  if (TVar3 == TYPE_GROUP) {
    pFVar5 = (FieldDescriptor *)message_type(this);
  }
  local_1e8.text_ = (char *)**(undefined8 **)pFVar5;
  local_1e8.size_ = *(int *)(*(undefined8 **)pFVar5 + 1);
  strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_218,*(int *)(this + 0x38));
  local_248.text_ = (char *)0x0;
  local_248.size_ = 0xffffffff;
  local_60.text_ = (char *)0x0;
  local_60.size_ = -1;
  local_90.text_ = (char *)0x0;
  local_90.size_ = -1;
  local_c0.text_ = (char *)0x0;
  local_c0.size_ = -1;
  local_298._0_8_ = (pointer)0x0;
  local_298._8_4_ = -1;
  strings::SubstituteAndAppend
            (contents,"$0$1$2 $3 = $4",(SubstituteArg *)&formatted_options,&local_188,&local_1b8,
             &local_1e8,(SubstituteArg *)local_218,(SubstituteArg *)(local_298 + 0x50),&local_60,
             &local_90,&local_c0,(SubstituteArg *)local_298);
  bVar1 = this[0x98] == (FieldDescriptor)0x1;
  if (bVar1) {
    DefaultValueAsString_abi_cxx11_((string *)(local_298 + 0x30),this,true);
    local_188.text_ = (pointer)0x0;
    local_188.size_ = -1;
    local_1b8.text_ = (pointer)0x0;
    local_1b8.size_ = -1;
    local_1e8.text_ = (char *)0x0;
    local_1e8.size_ = -1;
    local_218._0_8_ = (char *)0x0;
    local_218._8_4_ = -1;
    local_248.text_ = (char *)0x0;
    local_248.size_ = 0xffffffff;
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    formatted_options._M_dataplus._M_p = local_268._M_dataplus._M_p;
    local_c0.size_ = -1;
    local_298._0_8_ = (pointer)0x0;
    formatted_options._M_string_length =
         CONCAT44(formatted_options._M_string_length._4_4_,(undefined4)local_268._M_string_length);
    local_298._8_4_ = -1;
    strings::SubstituteAndAppend
              (contents," [default = $0",(SubstituteArg *)&formatted_options,&local_188,&local_1b8,
               &local_1e8,(SubstituteArg *)local_218,(SubstituteArg *)(local_298 + 0x50),&local_60,
               &local_90,&local_c0,(SubstituteArg *)local_298);
    std::__cxx11::string::~string((string *)(local_298 + 0x30));
  }
  if (this[0x20] == (FieldDescriptor)0x1) {
    if (bVar1) {
      std::__cxx11::string::append((char *)contents);
    }
    else {
      std::__cxx11::string::append((char *)contents);
    }
    bVar1 = true;
    std::__cxx11::string::append((char *)contents);
    CEscape(&formatted_options,*(string **)(this + 0x28));
    std::__cxx11::string::append((string *)contents);
    std::__cxx11::string::~string((string *)&formatted_options);
    std::__cxx11::string::append((char *)contents);
  }
  formatted_options._M_dataplus._M_p = (pointer)&formatted_options.field_2;
  formatted_options._M_string_length = 0;
  formatted_options.field_2._M_local_buf[0] = '\0';
  bVar2 = anon_unknown_1::FormatBracketedOptions
                    (depth,*(Message **)(this + 0x80),
                     *(DescriptorPool **)(*(long *)(this + 0x30) + 0x10),&formatted_options);
  if (bVar2) {
    std::__cxx11::string::append((char *)contents);
    std::__cxx11::string::append((string *)contents);
  }
  else if (!bVar1) goto LAB_005bacce;
  std::__cxx11::string::append((char *)contents);
LAB_005bacce:
  TVar3 = type(this);
  if ((TVar3 == TYPE_GROUP) && (debug_string_options->elide_group_body == false)) {
    pDVar4 = message_type(this);
    Descriptor::DebugString(pDVar4,depth,contents,debug_string_options,false);
  }
  else {
    std::__cxx11::string::append((char *)contents);
  }
  anon_unknown_1::SourceLocationCommentPrinter::AddPostComment(&comment_printer,contents);
  std::__cxx11::string::~string((string *)&formatted_options);
  anon_unknown_1::SourceLocationCommentPrinter::~SourceLocationCommentPrinter(&comment_printer);
  std::__cxx11::string::~string((string *)&label);
  std::__cxx11::string::~string((string *)&field_type);
  std::__cxx11::string::~string((string *)&prefix);
  return;
}

Assistant:

void FieldDescriptor::DebugString(int depth,
                                  PrintLabelFlag print_label_flag,
                                  string *contents,
                                  const DebugStringOptions&
                                  debug_string_options) const {
  string prefix(depth * 2, ' ');
  string field_type;

  // Special case map fields.
  if (is_map()) {
    strings::SubstituteAndAppend(
        &field_type, "map<$0, $1>",
        message_type()->field(0)->FieldTypeNameDebugString(),
        message_type()->field(1)->FieldTypeNameDebugString());
  } else {
    field_type = FieldTypeNameDebugString();
  }

  bool print_label = true;
  // Determine whether to omit label:
  //   1. For an optional field, omit label if it's in oneof or in proto3.
  //   2. For a repeated field, omit label if it's a map.
  if (is_optional() && (print_label_flag == OMIT_LABEL ||
                        file()->syntax() == FileDescriptor::SYNTAX_PROTO3)) {
    print_label = false;
  } else if (is_map()) {
    print_label = false;
  }
  string label;
  if (print_label) {
    label = kLabelToName[this->label()];
    label.push_back(' ');
  }

  SourceLocationCommentPrinter
      comment_printer(this, prefix, debug_string_options);
  comment_printer.AddPreComment(contents);

  strings::SubstituteAndAppend(contents, "$0$1$2 $3 = $4",
                               prefix,
                               label,
                               field_type,
                               type() == TYPE_GROUP ? message_type()->name() :
                                                      name(),
                               number());

  bool bracketed = false;
  if (has_default_value()) {
    bracketed = true;
    strings::SubstituteAndAppend(contents, " [default = $0",
                                 DefaultValueAsString(true));
  }
  if (has_json_name_) {
    if (!bracketed) {
      bracketed = true;
      contents->append("[");
    } else {
      contents->append(", ");
    }
    contents->append("json_name = \"");
    contents->append(CEscape(json_name()));
    contents->append("\"");
  }

  string formatted_options;
  if (FormatBracketedOptions(depth, options(), file()->pool(),
                             &formatted_options)) {
    contents->append(bracketed ? ", " : " [");
    bracketed = true;
    contents->append(formatted_options);
  }

  if (bracketed) {
    contents->append("]");
  }

  if (type() == TYPE_GROUP) {
    if (debug_string_options.elide_group_body) {
      contents->append(" { ... };\n");
    } else {
      message_type()->DebugString(depth, contents, debug_string_options,
                                  /* include_opening_clause */ false);
    }
  } else {
    contents->append(";\n");
  }

  comment_printer.AddPostComment(contents);
}